

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

bool __thiscall Rml::DataViewFor::Update(DataViewFor *this,DataModel *model)

{
  pointer *pppVar1;
  uint *puVar2;
  iterator __position;
  code *pcVar3;
  vector<Rml::Element*,std::allocator<Rml::Element*>> *pvVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  String *instancer_name;
  String *tag;
  Element *pEVar9;
  long lVar10;
  pointer ppVar11;
  long *plVar12;
  uint uVar13;
  ulong uVar14;
  Vector2f VVar15;
  initializer_list<Rml::DataAddressEntry> __l;
  ElementPtr new_element_ptr;
  DataAddress iterator_address;
  Element *new_element;
  DataAddress iterator_index_address;
  DataVariable variable;
  allocator_type local_1e1;
  Element *local_1e0;
  vector<Rml::Element*,std::allocator<Rml::Element*>> *local_1d8;
  _Head_base<0UL,_Rml::Element_*,_false> local_1d0;
  Element *local_1c8;
  uint local_1bc;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *local_1b8;
  undefined8 local_1b0;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_1a8;
  size_type sStack_1a0;
  uint *local_198;
  ObserverPtrBlock *local_190;
  uint local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_178;
  ulong local_160;
  size_type local_158;
  undefined1 local_150 [20];
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  float local_130;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *local_128;
  int local_120;
  BoxArea BStack_11c;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_118;
  size_type sStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  undefined1 local_f0 [24];
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_d8;
  DataModel *local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  Element *local_98;
  Vector2f local_90;
  Vector2f local_88;
  Vector2f local_80;
  Vector2f local_78;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_70;
  DataVariable local_58;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_48;
  
  local_80 = (Vector2f)&this->container_address;
  local_58 = DataModel::GetVariable(model,(DataAddress *)local_80);
  if (local_58.definition != (VariableDefinition *)0x0) {
    uVar7 = DataVariable::Size(&local_58);
    local_1d8 = (vector<Rml::Element*,std::allocator<Rml::Element*>> *)&this->elements;
    uVar14 = (ulong)((long)(this->elements).
                           super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->elements).
                          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    local_1c8 = DataView::GetElement(&this->super_DataView);
    uVar13 = (uint)uVar14;
    uVar8 = uVar13;
    if ((int)uVar13 < (int)uVar7) {
      uVar8 = uVar7;
    }
    local_158 = (size_type)(int)uVar7;
    local_1bc = uVar7;
    local_160 = uVar14;
    if (0 < (int)uVar8) {
      local_88 = (Vector2f)&this->attributes;
      local_a0 = (pointer)&this->iterator_name;
      local_b0 = (pointer)&this->iterator_index_name;
      local_b8 = (DataModel *)&this->rml_contents;
      ppVar11 = (pointer)(long)(int)uVar13;
      local_78.y = 0.0;
      local_78.x = (float)uVar8;
      VVar15.x = 0.0;
      VVar15.y = 0.0;
      local_a8 = ppVar11;
      local_98 = (Element *)this;
      local_90 = (Vector2f)model;
      do {
        pEVar9 = local_1c8;
        if ((long)ppVar11 <= (long)VVar15) {
          instancer_name = Element::GetTagName_abi_cxx11_(local_1c8);
          tag = Element::GetTagName_abi_cxx11_(pEVar9);
          Factory::InstanceElement
                    ((Factory *)&local_1e0,(Element *)0x0,instancer_name,tag,
                     (XMLAttributes *)local_88);
          local_178.
          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
                    (&local_178,
                     ((long)(((DataAddress *)&((Element *)this)->children)->
                            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(((DataAddress *)&((Element *)this)->children)->
                            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
                     1);
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::operator=
                    (&local_178,
                     (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                     local_80);
          puVar2 = (uint *)(local_150 + 0x10);
          local_150._8_8_ = (ObserverPtrBlock *)0x0;
          stack0xfffffffffffffec0 = stack0xfffffffffffffec0 & 0xffffffffffffff00;
          local_150._0_8_ = puVar2;
          local_130 = VVar15.x;
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
          emplace_back<Rml::DataAddressEntry>(&local_178,(DataAddressEntry *)local_150);
          if ((uint *)local_150._0_8_ != puVar2) {
            operator_delete((void *)local_150._0_8_,stack0xfffffffffffffec0 + 1);
          }
          local_198 = &local_188;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"literal","");
          if (local_198 == &local_188) {
            uStack_138 = uStack_180;
            uStack_134 = uStack_17c;
            local_150._0_8_ = puVar2;
          }
          else {
            local_150._0_8_ = local_198;
          }
          uStack_13c = uStack_184;
          local_150._16_4_ = local_188;
          local_150._8_8_ = local_190;
          local_190 = (ObserverPtrBlock *)0x0;
          local_188 = local_188 & 0xffffff00;
          local_130 = -NAN;
          local_1b8 = &local_1a8;
          local_198 = &local_188;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"int","");
          if (local_1b8 == &local_1a8) {
            sStack_110 = sStack_1a0;
            local_128 = &local_118;
          }
          else {
            local_128 = local_1b8;
          }
          local_118._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._1_7_ =
               local_1a8._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
               .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._1_7_;
          local_118._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._0_1_ =
               local_1a8._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
               .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._0_1_;
          local_120 = (int)local_1b0;
          BStack_11c = local_1b0._4_4_;
          local_1b0._0_4_ = 0;
          local_1b0._4_4_ = Margin;
          local_1a8._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._0_1_ = 0;
          local_108._M_allocated_capacity._0_4_ = 0xffffffff;
          plVar12 = (long *)local_f0;
          local_f8._M_p = (pointer)0x0;
          local_f0[0] = 0;
          __l._M_len = 3;
          __l._M_array = (iterator)local_150;
          local_1b8 = &local_1a8;
          local_108._8_8_ = plVar12;
          local_f0._16_4_ = VVar15.x;
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                    (&local_d8,__l,&local_1e1);
          lVar10 = -0x78;
          do {
            if (plVar12 != (long *)plVar12[-2]) {
              operator_delete((long *)plVar12[-2],*plVar12 + 1);
            }
            plVar12 = plVar12 + -5;
            lVar10 = lVar10 + 0x28;
          } while (lVar10 != 0);
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,
                            CONCAT71(local_1a8._M_t.
                                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                     .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl.
                                     _1_7_,local_1a8._M_t.
                                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                           .super__Head_base<0UL,_Rml::Element_*,_false>.
                                           _M_head_impl._0_1_) + 1);
          }
          ppVar11 = local_a8;
          if (local_198 != &local_188) {
            operator_delete(local_198,CONCAT44(uStack_184,local_188) + 1);
          }
          model = (DataModel *)local_90;
          local_70.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_178.
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_70.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_178.
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_70.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_178.
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_178.
          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          DataModel::InsertAlias((DataModel *)local_90,local_1e0,&local_a0->first,&local_70);
          this = (DataViewFor *)local_98;
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                    (&local_70);
          local_48.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_d8.
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_48.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_d8.
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_48.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_d8.
               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          DataModel::InsertAlias(model,local_1e0,&local_b0->first,&local_48);
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                    (&local_48);
          pEVar9 = Element::GetParentNode(local_1c8);
          local_1d0._M_head_impl = local_1e0;
          local_1e0 = (Element *)0x0;
          pEVar9 = Element::InsertBefore(pEVar9,(ElementPtr *)&local_1d0,local_1c8);
          if (local_1d0._M_head_impl != (Element *)0x0) {
            (*((local_1d0._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2]
            )();
          }
          local_1d0._M_head_impl = (Element *)0x0;
          __position._M_current =
               (Element **)
               (((Element *)this)->attributes).m_container.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_150._0_8_ = pEVar9;
          if ((Element *)__position._M_current == ((Element *)this)->offset_parent) {
            ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::
            _M_realloc_insert<Rml::Element*const&>(local_1d8,__position,(Element **)local_150);
          }
          else {
            *__position._M_current = pEVar9;
            pppVar1 = &(((Element *)this)->attributes).m_container.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *pppVar1 = (pointer)&((*pppVar1)->first)._M_string_length;
          }
          Element::SetInnerRML
                    (*(Element **)(*(long *)local_1d8 + (long)VVar15 * 8),(String *)local_b8);
          if ((long)(int)((ulong)((long)(((Element *)this)->attributes).m_container.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)(((Element *)this)->attributes).m_container.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish) >> 3) <=
              (long)VVar15) {
            bVar6 = Assert("RMLUI_ASSERT(i < (int)elements.size())",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                           ,0x228);
            if (!bVar6) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
          }
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                    (&local_d8);
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                    (&local_178);
          if (local_1e0 != (Element *)0x0) {
            (*(local_1e0->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
          }
        }
        pvVar4 = local_1d8;
        if ((long)local_158 <= (long)VVar15) {
          DataModel::EraseAliases(model,*(Element **)(*(long *)local_1d8 + (long)VVar15 * 8));
          pEVar9 = Element::GetParentNode(*(Element **)(*(long *)pvVar4 + (long)VVar15 * 8));
          Element::RemoveChild((Element *)local_150,pEVar9);
          uVar5 = local_150._0_8_;
          local_150._0_8_ = (Element *)0x0;
          if ((Element *)uVar5 != (Element *)0x0) {
            (**(code **)(*(long *)uVar5 + 0x10))();
          }
          if ((Element *)local_150._0_8_ != (Element *)0x0) {
            (**(code **)(*(long *)local_150._0_8_ + 0x10))();
          }
          *(undefined8 *)(*(long *)local_1d8 + (long)VVar15 * 8) = 0;
        }
        VVar15 = (Vector2f)((long)VVar15 + 1);
      } while (VVar15 != local_78);
    }
    if ((int)local_1bc < (int)local_160) {
      ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::resize
                ((vector<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)local_1d8,local_158);
    }
  }
  return false;
}

Assistant:

bool DataViewFor::Update(DataModel& model)
{
	DataVariable variable = model.GetVariable(container_address);
	if (!variable)
		return false;

	bool result = false;
	const int size = variable.Size();
	const int num_elements = (int)elements.size();
	Element* element = GetElement();

	for (int i = 0; i < Math::Max(size, num_elements); i++)
	{
		if (i >= num_elements)
		{
			ElementPtr new_element_ptr = Factory::InstanceElement(nullptr, element->GetTagName(), element->GetTagName(), attributes);

			DataAddress iterator_address;
			iterator_address.reserve(container_address.size() + 1);
			iterator_address = container_address;
			iterator_address.push_back(DataAddressEntry(i));

			DataAddress iterator_index_address = {{"literal"}, {"int"}, {i}};

			model.InsertAlias(new_element_ptr.get(), iterator_name, std::move(iterator_address));
			model.InsertAlias(new_element_ptr.get(), iterator_index_name, std::move(iterator_index_address));

			Element* new_element = element->GetParentNode()->InsertBefore(std::move(new_element_ptr), element);
			elements.push_back(new_element);

			elements[i]->SetInnerRML(rml_contents);

			RMLUI_ASSERT(i < (int)elements.size());
		}
		if (i >= size)
		{
			model.EraseAliases(elements[i]);
			elements[i]->GetParentNode()->RemoveChild(elements[i]).reset();
			elements[i] = nullptr;
		}
	}

	if (num_elements > size)
		elements.resize(size);

	return result;
}